

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O2

void __thiscall
CaDiCaL::LratChecker::weaken_minus
          (LratChecker *this,uint64_t id,vector<int,_std::allocator<int>_> *c)

{
  uint uVar1;
  LratCheckerClause *pLVar2;
  uint *puVar3;
  pointer piVar4;
  uint uVar5;
  int *lit;
  LratCheckerClause **ppLVar6;
  uint *puVar7;
  mapped_type *this_00;
  int *lit_1;
  int *lit_3;
  ulong uVar8;
  uint64_t id_local;
  vector<int,_std::allocator<int>_> e;
  
  id_local = id;
  import_clause(this,c);
  this->last_id = id;
  ppLVar6 = find(this,id);
  pLVar2 = *ppLVar6;
  if (pLVar2 == (LratCheckerClause *)0x0) {
    fatal_message_start();
    fputs("weakened clause not in proof:\n",_stderr);
    puVar3 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar7 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar3;
        puVar7 = puVar7 + 1) {
      fprintf(_stderr,"%d ",(ulong)*puVar7);
    }
    fputc(0x30,_stderr);
    fatal_message_end();
  }
  else {
    puVar3 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar7 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar3;
        puVar7 = puVar7 + 1) {
      uVar1 = *puVar7;
      uVar5 = -uVar1;
      if (0 < (int)uVar1) {
        uVar5 = uVar1;
      }
      (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[~(~uVar1 >> 0x1f) + uVar5 * 2] = '\x01';
    }
    for (uVar8 = 0; uVar8 < pLVar2->size; uVar8 = uVar8 + 1) {
      uVar1 = pLVar2->literals[uVar8];
      uVar5 = -uVar1;
      if (0 < (int)uVar1) {
        uVar5 = uVar1;
      }
      if ((this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[~(~uVar1 >> 0x1f) + uVar5 * 2] == '\0') {
        fatal_message_start();
        fputs("deleted clause not in proof:\n",_stderr);
        puVar3 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
        for (puVar7 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar3;
            puVar7 = puVar7 + 1) {
          fprintf(_stderr,"%d ",(ulong)*puVar7);
        }
        fputc(0x30,_stderr);
        fatal_message_end();
      }
    }
    puVar3 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar7 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar3;
        puVar7 = puVar7 + 1) {
      uVar1 = *puVar7;
      uVar5 = -uVar1;
      if (0 < (int)uVar1) {
        uVar5 = uVar1;
      }
      (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[~(~uVar1 >> 0x1f) + uVar5 * 2] = '\0';
    }
  }
  piVar4 = (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar4) {
    (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4;
  }
  std::vector<int,_std::allocator<int>_>::vector(&e,c);
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  this_00 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->clauses_to_reconstruct,&id_local);
  std::vector<int,_std::allocator<int>_>::operator=(this_00,&e);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&e.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void LratChecker::weaken_minus (uint64_t id, const vector<int> &c) {
  LOG (c, "LRAT CHECKER saving clause[%" PRIu64 "] to restore later", id);
  import_clause (c);

  assert (id <= current_id);
  last_id = id;
  LratCheckerClause **p = find (id), *d = *p;
  if (d) {
    for (const auto &lit : imported_clause)
      mark (lit) = true;
    const int *dp = d->literals;
    for (unsigned i = 0; i < d->size; i++) {
      int lit = *(dp + i);
      if (!mark (lit)) {        // should never happen since ids
        fatal_message_start (); // are unique.
        fputs ("deleted clause not in proof:\n", stderr);
        for (const auto &lit : imported_clause)
          fprintf (stderr, "%d ", lit);
        fputc ('0', stderr);
        fatal_message_end ();
      }
    }
    for (const auto &lit : imported_clause)
      mark (lit) = false;
  } else {
    fatal_message_start ();
    fputs ("weakened clause not in proof:\n", stderr);
    for (const auto &lit : imported_clause)
      fprintf (stderr, "%d ", lit);
    fputc ('0', stderr);
    fatal_message_end ();
  }
  imported_clause.clear ();

  vector<int> e = c;
  sort (begin (e), end (e));
  clauses_to_reconstruct[id] = e;
}